

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O3

unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
__thiscall
duckdb::ClientContext::PrepareInternal
          (ClientContext *this,ClientContextLock *lock,
          unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
          *statement)

{
  pointer pcVar1;
  _Head_base<0UL,_duckdb::SQLStatement_*,_false> _Var2;
  _Head_base<0UL,_duckdb::SQLStatement_*,_false> _Var3;
  pointer pSVar4;
  PreparedStatementData *pPVar5;
  unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *in_RCX;
  shared_ptr<duckdb::PreparedStatementData,_true> prepared_data;
  string statement_query;
  case_insensitive_map_t<idx_t> named_param_map;
  _Head_base<0UL,_duckdb::SQLStatement_*,_false> local_c0;
  shared_ptr<duckdb::PreparedStatementData,_true> local_b8;
  _Any_data local_a8;
  code *local_98;
  code *local_90;
  undefined1 local_88 [32];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  local_68;
  
  pSVar4 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
           operator->(in_RCX);
  local_88._0_8_ = &local_68;
  local_68._M_h._M_buckets = (__buckets_ptr)0x0;
  local_68._M_h._M_bucket_count = (pSVar4->named_param_map)._M_h._M_bucket_count;
  local_68._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_h._M_element_count = (pSVar4->named_param_map)._M_h._M_element_count;
  local_68._M_h._M_rehash_policy._M_max_load_factor =
       (pSVar4->named_param_map)._M_h._M_rehash_policy._M_max_load_factor;
  local_68._M_h._M_rehash_policy._4_4_ =
       *(undefined4 *)&(pSVar4->named_param_map)._M_h._M_rehash_policy.field_0x4;
  local_68._M_h._M_rehash_policy._M_next_resize =
       (pSVar4->named_param_map)._M_h._M_rehash_policy._M_next_resize;
  local_68._M_h._M_single_bucket = (__node_base_ptr)0x0;
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,unsigned_long>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_88._0_8_,&(pSVar4->named_param_map)._M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>_>_>
              *)local_88);
  pSVar4 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
           operator->(in_RCX);
  pcVar1 = (pSVar4->query)._M_dataplus._M_p;
  local_88._0_8_ = (__hashtable_alloc *)(local_88 + 0x10);
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_88,pcVar1,pcVar1 + (pSVar4->query)._M_string_length);
  local_b8.internal.super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_b8.internal.super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pSVar4 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
           operator->(in_RCX);
  (*pSVar4->_vptr_SQLStatement[3])(&local_c0);
  local_a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_a8._M_unused._M_object = operator_new(0x28);
  *(shared_ptr<duckdb::PreparedStatementData,_true> **)local_a8._M_unused._0_8_ = &local_b8;
  *(ClientContextLock **)((long)local_a8._M_unused._0_8_ + 8) = lock;
  *(unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> **)
   ((long)local_a8._M_unused._0_8_ + 0x10) = statement;
  *(string **)((long)local_a8._M_unused._0_8_ + 0x18) = (string *)local_88;
  *(unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> **)
   ((long)local_a8._M_unused._0_8_ + 0x20) = in_RCX;
  local_90 = ::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/main/client_context.cpp:689:12)>
             ::_M_invoke;
  local_98 = ::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/main/client_context.cpp:689:12)>
             ::_M_manager;
  RunFunctionInTransactionInternal
            ((ClientContext *)lock,(ClientContextLock *)pSVar4,(function<void_()> *)&local_a8,false)
  ;
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,__destroy_functor);
  }
  pPVar5 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->(&local_b8);
  _Var3._M_head_impl = local_c0._M_head_impl;
  local_c0._M_head_impl = (SQLStatement *)0x0;
  _Var2._M_head_impl =
       (pPVar5->unbound_statement).
       super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
       super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
       super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
  (pPVar5->unbound_statement).
  super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
  super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
  super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl = _Var3._M_head_impl;
  if (_Var2._M_head_impl != (SQLStatement *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_SQLStatement + 8))();
  }
  enable_shared_from_this<duckdb::ClientContext>::shared_from_this
            ((enable_shared_from_this<duckdb::ClientContext> *)&local_a8);
  make_uniq<duckdb::PreparedStatement,duckdb::shared_ptr<duckdb::ClientContext,true>,duckdb::shared_ptr<duckdb::PreparedStatementData,true>,std::__cxx11::string,std::unordered_map<std::__cxx11::string,unsigned_long,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>>
            ((duckdb *)this,(shared_ptr<duckdb::ClientContext,_true> *)&local_a8,&local_b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,&local_68
            );
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
  }
  if (local_c0._M_head_impl != (SQLStatement *)0x0) {
    (*(local_c0._M_head_impl)->_vptr_SQLStatement[1])();
  }
  if (local_b8.internal.
      super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.internal.
               super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((__hashtable_alloc *)local_88._0_8_ != (__hashtable_alloc *)(local_88 + 0x10)) {
    operator_delete((void *)local_88._0_8_);
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_68);
  return (unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>)
         (unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>)
         this;
}

Assistant:

unique_ptr<PreparedStatement> ClientContext::PrepareInternal(ClientContextLock &lock,
                                                             unique_ptr<SQLStatement> statement) {
	auto named_param_map = statement->named_param_map;
	auto statement_query = statement->query;
	shared_ptr<PreparedStatementData> prepared_data;
	auto unbound_statement = statement->Copy();
	RunFunctionInTransactionInternal(
	    lock, [&]() { prepared_data = CreatePreparedStatement(lock, statement_query, std::move(statement)); }, false);
	prepared_data->unbound_statement = std::move(unbound_statement);
	return make_uniq<PreparedStatement>(shared_from_this(), std::move(prepared_data), std::move(statement_query),
	                                    std::move(named_param_map));
}